

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

void __thiscall QDebugStateSaverPrivate::restoreState(QDebugStateSaverPrivate *this)

{
  bool bVar1;
  Stream *pSVar2;
  _Head_base<0UL,_QTextStreamPrivate_*,_false> _Var3;
  undefined8 uVar4;
  undefined8 uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  
  bVar1 = this->m_stream->space;
  if ((bVar1 == true) && (this->m_spaces == false)) {
    bVar8 = QString::endsWith(&this->m_stream->buffer,(QChar)0x20,CaseSensitive);
    if (bVar8) {
      QString::chop(&this->m_stream->buffer,1);
    }
  }
  pSVar2 = this->m_stream;
  pSVar2->space = this->m_spaces;
  pSVar2->noQuotes = this->m_noQuotes;
  _Var3._M_head_impl =
       (pSVar2->ts).d_ptr._M_t.
       super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
       super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
       super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  iVar6 = (this->m_streamParams).realNumberPrecision;
  iVar7 = (this->m_streamParams).integerBase;
  uVar4 = *(undefined8 *)&(this->m_streamParams).fieldWidth;
  uVar5 = *(undefined8 *)&(this->m_streamParams).realNumberNotation;
  *(undefined8 *)((long)&(_Var3._M_head_impl)->params + 0xc) =
       *(undefined8 *)&(this->m_streamParams).padChar;
  *(undefined8 *)((long)&(_Var3._M_head_impl)->params + 0x14) = uVar5;
  ((_Var3._M_head_impl)->params).realNumberPrecision = iVar6;
  ((_Var3._M_head_impl)->params).integerBase = iVar7;
  *(undefined8 *)((long)&(_Var3._M_head_impl)->params + 8) = uVar4;
  pSVar2 = this->m_stream;
  pSVar2->verbosity = this->m_verbosity;
  if ((bVar1 == false) && (this->m_spaces == true)) {
    ::QTextStream::operator<<(&pSVar2->ts,' ');
    return;
  }
  return;
}

Assistant:

void restoreState()
    {
        const bool currentSpaces = m_stream->space;
        if (currentSpaces && !m_spaces)
            if (m_stream->buffer.endsWith(u' '))
                m_stream->buffer.chop(1);

        m_stream->space = m_spaces;
        m_stream->noQuotes = m_noQuotes;
        m_stream->ts.d_ptr->params = m_streamParams;
        m_stream->verbosity = m_verbosity;

        if (!currentSpaces && m_spaces)
            m_stream->ts << ' ';
    }